

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streambuf.c
# Opt level: O3

void quicly_sendbuf_dispose(quicly_sendbuf_t *sb)

{
  quicly_sendbuf_vec_t *pqVar1;
  code *pcVar2;
  size_t sVar3;
  long lVar4;
  size_t sVar5;
  
  sVar3 = (sb->vecs).size;
  if (sVar3 != 0) {
    lVar4 = 0;
    sVar5 = 0;
    do {
      pqVar1 = (sb->vecs).entries;
      pcVar2 = *(code **)(*(long *)((long)&pqVar1->cb + lVar4) + 8);
      if (pcVar2 != (code *)0x0) {
        (*pcVar2)((long)&pqVar1->cb + lVar4);
        sVar3 = (sb->vecs).size;
      }
      sVar5 = sVar5 + 1;
      lVar4 = lVar4 + 0x18;
    } while (sVar5 != sVar3);
  }
  free((sb->vecs).entries);
  return;
}

Assistant:

void quicly_sendbuf_dispose(quicly_sendbuf_t *sb)
{
    size_t i;

    for (i = 0; i != sb->vecs.size; ++i) {
        quicly_sendbuf_vec_t *vec = sb->vecs.entries + i;
        if (vec->cb->discard_vec != NULL)
            vec->cb->discard_vec(vec);
    }
    free(sb->vecs.entries);
}